

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void Hacl_Impl_Ed25519_Sign_Steps_point_mul_g_compress(uint8_t *out,uint8_t *s)

{
  uint64_t *in_RSI;
  uint64_t tmp [20];
  undefined1 auStack_b8 [160];
  uint8_t *in_stack_ffffffffffffffe8;
  
  memset(auStack_b8,0,0xa0);
  Hacl_Impl_Ed25519_Sign_Steps_point_mul_g(in_RSI,in_stack_ffffffffffffffe8);
  Hacl_Impl_Ed25519_PointCompress_point_compress((uint8_t *)tmp[2],(uint64_t *)tmp[1]);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Sign_Steps_point_mul_g_compress(uint8_t *out, uint8_t *s)
{
  uint64_t tmp[20U] = { 0U };
  Hacl_Impl_Ed25519_Sign_Steps_point_mul_g(tmp, s);
  Hacl_Impl_Ed25519_PointCompress_point_compress(out, tmp);
}